

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::primaryExpr(Parser *this,TokIter *iter,TokIter end)

{
  Position beg;
  Position beg_00;
  Position end_00;
  Position end_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  TokenID TVar3;
  mapped_type *pmVar4;
  CompileError *pCVar5;
  TokIter in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  shared_ptr<mocker::ast::IdentifierExpr> sVar7;
  shared_ptr<mocker::ast::LiteralExpr> sVar8;
  shared_ptr<mocker::ast::NewExpr> sVar9;
  shared_ptr<mocker::ast::Expression> sVar10;
  Position beg_01;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  args;
  size_t local_80;
  shared_ptr<mocker::ast::IdentifierExpr> identExpr;
  shared_ptr<mocker::ast::Identifier> ident;
  undefined1 local_58 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  element_type *local_38;
  
  sVar7 = identifierExpr((Parser *)&identExpr,iter,end);
  _Var6 = sVar7.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (identExpr.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    if (identExpr.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (identExpr.
                 super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    sVar8 = literalExpr((Parser *)&args,iter,end);
    _Var6 = sVar8.super___shared_ptr<mocker::ast::LiteralExpr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (args.
        super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      if (args.
          super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   args.
                   super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      sVar9 = newExpr((Parser *)&args,iter,end);
      _Var6 = sVar9.super___shared_ptr<mocker::ast::NewExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (args.
          super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        if (args.
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     args.
                     super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        Token::position(*end._M_current);
        _Var6._M_pi = extraout_RDX_03;
        if (*end._M_current != in_RCX._M_current) {
          beg_00.col = (size_t)args.
                               super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          beg_00.line = (size_t)args.
                                super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
          beg.col = (size_t)args.
                            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          beg.line = (size_t)args.
                             super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          TVar3 = Token::tokenID(*end._M_current);
          _Var6._M_pi = extraout_RDX_04;
          if (TVar3 == LeftParen) {
            *(long *)end._M_current = *(long *)end._M_current + 0x38;
            args.
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)logicalOrExpr;
            args.
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            identExpr.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x2f;
            args.
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)iter;
            sVar10 = auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
                               (this,iter,end,
                                (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
                                 *)in_RCX._M_current,
                                (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> *)&args);
            _Var6 = sVar10.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            if ((this->tokBeg)._M_current == (Token *)0x0) {
              pCVar5 = (CompileError *)__cxa_allocate_exception(0x48);
              Token::position(*end._M_current);
              end_00.col = local_80;
              end_00.line = (size_t)args.
                                    super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
              CompileError::CompileError(pCVar5,beg,end_00);
              *(undefined ***)pCVar5 = &PTR__CompileError_001f2a98;
              __cxa_throw(pCVar5,&SyntaxError::typeinfo,CompileError::~CompileError);
            }
            if (*end._M_current == in_RCX._M_current) {
              TVar3 = Error;
            }
            else {
              TVar3 = Token::tokenID(*end._M_current);
              _Var6._M_pi = extraout_RDX_05;
            }
            if (TVar3 != RightParen) {
              pCVar5 = (CompileError *)__cxa_allocate_exception(0x48);
              Token::position(*end._M_current);
              end_01.col = local_80;
              end_01.line = (size_t)args.
                                    super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
              CompileError::CompileError(pCVar5,beg_00,end_01);
              *(undefined ***)pCVar5 = &PTR__CompileError_001f2a98;
              __cxa_throw(pCVar5,&SyntaxError::typeinfo,CompileError::~CompileError);
            }
            *(long *)end._M_current = *(long *)end._M_current + 0x38;
            goto LAB_00180a08;
          }
        }
        (this->tokBeg)._M_current = (Token *)0x0;
        (this->tokEnd)._M_current = (Token *)0x0;
        goto LAB_00180a08;
      }
    }
    (this->tokBeg)._M_current =
         (Token *)args.
                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->tokEnd)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current =
         (Token *)args.
                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (*end._M_current == in_RCX._M_current) {
      TVar3 = Error;
    }
    else {
      TVar3 = Token::tokenID(*end._M_current);
      _Var6._M_pi = extraout_RDX;
    }
    _Var1._M_pi = identExpr.
                  super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (TVar3 == LeftParen) {
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
      ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((identExpr.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = ((identExpr.
                super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      exprList(&args,(Parser *)iter,(TokIter *)end._M_current,in_RCX);
      if (*end._M_current == in_RCX._M_current) {
        TVar3 = Error;
      }
      else {
        TVar3 = Token::tokenID(*end._M_current);
      }
      if (TVar3 != RightParen) {
        __assert_fail("id(iter) == TokenID::RightParen",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0xb6,
                      "std::shared_ptr<ast::Expression> mocker::Parser::primaryExpr(TokIter &, TokIter)"
                     );
      }
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
      local_38 = ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      pmVar4 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)iter[2]._M_current,(key_type *)&local_38);
      local_58._16_8_ =
           (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
            *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      beg_01.col = (pmVar4->first).line;
      beg_01.line = (size_t)iter;
      makeNode<mocker::ast::FuncCallExpr,std::shared_ptr<mocker::ast::Expression>,std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::Expression>,std::allocator<std::shared_ptr<mocker::ast::Expression>>>>
                ((Parser *)local_58,beg_01,*(Position *)&(pmVar4->first).col,
                 (shared_ptr<mocker::ast::Expression> *)(pmVar4->second).col,
                 (shared_ptr<mocker::ast::Identifier> *)(local_58 + 0x10),
                 (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  *)&ident);
      uVar2 = local_58._8_8_;
      (this->tokBeg)._M_current = (Token *)local_58._0_8_;
      (this->tokEnd)._M_current = (Token *)0x0;
      local_58._8_8_ = (Token *)0x0;
      (this->tokEnd)._M_current = (Token *)uVar2;
      local_58._0_8_ = (Token *)0x0;
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      std::
      vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
      ::~vector(&args);
      _Var6._M_pi = extraout_RDX_00;
      if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var6._M_pi = extraout_RDX_01;
      }
    }
    else {
      (this->tokBeg)._M_current =
           (Token *)identExpr.
                    super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      (this->tokEnd)._M_current = (Token *)0x0;
      identExpr.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->tokEnd)._M_current = (Token *)_Var1._M_pi;
      identExpr.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    if (identExpr.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (identExpr.
                 super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_02;
    }
  }
LAB_00180a08:
  sVar10.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar10.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar10.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::primaryExpr(TokIter &iter,
                                                     TokIter end) {
  auto id = GetTokenID(end);
  if (auto identExpr = identifierExpr(iter, end)) {
    if (id(iter) != TokenID::LeftParen)
      return identExpr;
    ++iter;
    auto ident = identExpr->identifier;
    auto args = exprList(iter, end);
    assert(id(iter) == TokenID::RightParen);
    ++iter;
    return makeNode<ast::FuncCallExpr>(
        pos[ident->getID()], std::shared_ptr<ast::Expression>(nullptr),
        std::move(ident), std::move(args));
  }
  if (auto res = literalExpr(iter, end))
    return res;
  if (auto res = newExpr(iter, end))
    return res;

  auto begPos = iter->position().first;
  if (id(iter) != TokenID::LeftParen)
    return nullptr;
  ++iter;
  auto expr = expression(iter, end);
  if (!expr)
    throw SyntaxError(begPos, iter->position().second);
  if (id(iter) != TokenID::RightParen)
    throw SyntaxError(begPos, iter->position().second);
  ++iter;
  return expr;
}